

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintNgeneric.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintNgeneric::ArchiveIN(ChConstraintNgeneric *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChConstraintNgeneric>(marchive);
  ChConstraint::ArchiveIN(&this->super_ChConstraint,marchive);
  return;
}

Assistant:

void ChConstraintNgeneric::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChConstraintNgeneric>();

    // deserialize the parent class data too
    ChConstraint::ArchiveIN(marchive);

    // deserialize all member data:
    // NOTHING INTERESTING TO SERIALIZE
}